

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav_ins.c
# Opt level: O0

void fsnav_ins_scheduler(void)

{
  char *pcVar1;
  char *cfg_ptr;
  char madgwick_token [23];
  double t0_default;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  char cStack_4c;
  char cStack_4b;
  char t0_token [10];
  double limit_default;
  char cStack_38;
  char cStack_37;
  char limit_token [11];
  char yaw_token [9];
  char accs_token [11];
  char g_token [8];
  char e2_token [8];
  char u_token [7];
  
  builtin_strncpy(e2_token,"u_zero",7);
  builtin_strncpy(g_token,"e2_zero",8);
  accs_token[3] = 'g';
  accs_token[4] = '_';
  accs_token[5] = 'c';
  accs_token[6] = 'o';
  accs_token[7] = 'n';
  accs_token[8] = 's';
  accs_token[9] = 't';
  accs_token[10] = '\0';
  yaw_token[1] = 'a';
  yaw_token[2] = 'c';
  yaw_token[3] = 'c';
  yaw_token[4] = 's';
  yaw_token[5] = '_';
  yaw_token[6] = 'a';
  yaw_token[7] = 'l';
  yaw_token[8] = 'i';
  accs_token[0] = 'g';
  accs_token[1] = 'n';
  accs_token[2] = '\0';
  limit_token[3] = 'y';
  limit_token[4] = 'a';
  limit_token[5] = 'w';
  limit_token[6] = '_';
  limit_token[7] = 'z';
  limit_token[8] = 'e';
  limit_token[9] = 'r';
  limit_token[10] = 'o';
  yaw_token[0] = '\0';
  limit_default._2_1_ = 't';
  limit_default._3_1_ = 'i';
  limit_default._4_1_ = 'm';
  limit_default._5_1_ = 'e';
  limit_default._6_1_ = '_';
  limit_default._7_1_ = 'l';
  cStack_38 = 'i';
  cStack_37 = 'm';
  limit_token[0] = 'i';
  limit_token[1] = 't';
  limit_token[2] = '\0';
  t0_token[2] = -1;
  t0_token[3] = -1;
  t0_token[4] = -1;
  t0_token[5] = -1;
  t0_token[6] = -1;
  t0_token[7] = -1;
  t0_token[8] = -0x11;
  t0_token[9] = '\x7f';
  t0_default._6_1_ = 'a';
  t0_default._7_1_ = 'l';
  cStack_50 = 'i';
  cStack_4f = 'g';
  cStack_4e = 'n';
  cStack_4d = 'm';
  cStack_4c = 'e';
  cStack_4b = 'n';
  t0_token[0] = 't';
  t0_token[1] = '\0';
  stack0xffffffffffffffa0 = 0x4072c00000000000;
  cfg_ptr = (char *)0x6b6369776764616d;
  madgwick_token[0] = '_';
  madgwick_token[1] = 'f';
  madgwick_token[2] = 'e';
  madgwick_token[3] = 'e';
  madgwick_token[4] = 'd';
  madgwick_token[5] = 'b';
  madgwick_token[6] = 'a';
  madgwick_token[7] = 'c';
  madgwick_token[8] = 'k';
  madgwick_token[9] = '_';
  madgwick_token[10] = 'r';
  madgwick_token[0xb] = 'a';
  madgwick_token[0xc] = 't';
  madgwick_token[0xd] = 'e';
  madgwick_token[0xe] = '\0';
  if (fsnav->mode == 0) {
    printf("16-bit mode of IMU measurements\n");
    pcVar1 = fsnav_locate_token(e2_token,fsnav->cfg_settings,fsnav->settings_length,'\0');
    if (pcVar1 != (char *)0x0) {
      (fsnav->imu_const).u = 0.0;
      printf("u_zero\n");
    }
    pcVar1 = fsnav_locate_token(g_token,fsnav->cfg_settings,fsnav->settings_length,'\0');
    if (pcVar1 != (char *)0x0) {
      (fsnav->imu_const).e2 = 0.0;
      printf("e2_zero\n");
    }
    pcVar1 = fsnav_locate_token(accs_token + 3,fsnav->cfg_settings,fsnav->settings_length,'\0');
    if (pcVar1 == (char *)0x0) {
      (*fsnav->suspend_plugin)(fsnav_ins_gravity_constant);
    }
    else {
      (*fsnav->suspend_plugin)(fsnav_ins_gravity_normal);
      printf("g_const\n");
    }
    pcVar1 = fsnav_locate_token((char *)&cfg_ptr,fsnav->imu->cfg,fsnav->imu->cfglength,'=');
    if (pcVar1 == (char *)0x0) {
      (*fsnav->suspend_plugin)(fsnav_ins_attitude_madgwick);
    }
    else {
      fsnav_ins_scheduler::madgwick_rate = atof(pcVar1);
      if ((fsnav_ins_scheduler::madgwick_rate <= 0.0) ||
         (0x7fefffffffffffff < (ulong)ABS(fsnav_ins_scheduler::madgwick_rate))) {
        (*fsnav->suspend_plugin)(fsnav_ins_attitude_madgwick);
      }
      else {
        (*fsnav->suspend_plugin)(fsnav_ins_attitude_rodrigues);
        printf("%s = %g\n",SUB84(fsnav_ins_scheduler::madgwick_rate,0),&cfg_ptr);
      }
    }
    pcVar1 = fsnav_locate_token(yaw_token + 1,fsnav->cfg_settings,fsnav->settings_length,'\0');
    if (pcVar1 == (char *)0x0) {
      (*fsnav->suspend_plugin)(fsnav_ins_alignment_static_accs);
    }
    else {
      (*fsnav->suspend_plugin)(fsnav_ins_alignment_static);
      printf("accs_align\n");
    }
    pcVar1 = fsnav_locate_token(limit_token + 3,fsnav->cfg_settings,fsnav->settings_length,'\0');
    if (pcVar1 == (char *)0x0) {
      fsnav_ins_scheduler::yaw_zero = '\0';
      (*fsnav->suspend_plugin)(fsnav_ins_set_yaw_zero);
    }
    else {
      fsnav_ins_scheduler::yaw_zero = '\x01';
      printf("yaw_zero\n");
    }
    pcVar1 = fsnav_locate_token((char *)((long)&limit_default + 2),fsnav->cfg_settings,
                                fsnav->settings_length,'=');
    if ((pcVar1 == (char *)0x0) ||
       (fsnav_ins_scheduler::time_limit = atof(pcVar1), fsnav_ins_scheduler::time_limit <= 0.0)) {
      fsnav_ins_scheduler::time_limit = 1.79769313486232e+308;
    }
    pcVar1 = fsnav_locate_token((char *)((long)&t0_default + 6),fsnav->imu->cfg,
                                fsnav->imu->cfglength,'=');
    if ((pcVar1 == (char *)0x0) ||
       (fsnav_ins_scheduler::t0 = atof(pcVar1), fsnav_ins_scheduler::t0 <= 0.0)) {
      fsnav_ins_scheduler::t0 = 300.0;
    }
  }
  else if (-1 < fsnav->mode) {
    if (fsnav_ins_scheduler::time_limit < fsnav->imu->t) {
      fsnav->mode = -1;
    }
    if ((fsnav_ins_scheduler::t0 < fsnav->imu->t) && (fsnav_ins_scheduler::yaw_zero != '\0')) {
      (*fsnav->suspend_plugin)(fsnav_ins_set_yaw_zero);
      fsnav_ins_scheduler::yaw_zero = '\0';
    }
  }
  return;
}

Assistant:

void fsnav_ins_scheduler(void)
{
	const char
		u_token       [] = "u_zero",     // имя параметра в строке конфигурации для обнуления угловой скорости земли
		e2_token      [] = "e2_zero",    // имя параметра в строке конфигурации для обнуления эксцентриситета
		g_token       [] = "g_const",    // имя параметра в строке конфигурации, определяющего режим счисления силы тяжести
		accs_token    [] = "accs_align", // имя параметра в строке конфигурации для выставки по акселерометрам
		yaw_token     [] = "yaw_zero";   // имя параметра в строке конфигурации для обнуления угла курса на этапе выставки
		
	static char yaw_zero; // флаг обнуления угла курса на этапе выставки

	const char    limit_token[] = "time_limit"; // имя параметра в строке конфигурации для ограничения по времени
	const double  limit_default = DBL_MAX;      // стандартное ограничение по времени (без ограничения), сек
	static double time_limit    = -1;

	const char    t0_token[] = "alignment"; // имя параметра в строке конфигурации с временем выставки
	const double  t0_default = 300;         // стандартное время выставки, сек
	static double t0         = -1;

	const char    madgwick_token[] = "madgwick_feedback_rate"; // имя параметра в строке конфигурации для счисления ориентации фильтром Мэджвика
	static double madgwick_rate    = -1;                       // параметр настройки фильтра Маджвика, рад/сек 

	char *cfg_ptr; // указатель на параметр в строке конфигурации

	// инициализация
	if (fsnav->mode == 0) {

#ifdef BIT16
	printf("16-bit mode of IMU measurements\n");
#else
	printf("32-bit mode of IMU measurements\n");
#endif

		// модификация констант на шине
			// поиск флага обнуления угловой скорости в конфигурации
		cfg_ptr = fsnav_locate_token(u_token, fsnav->cfg_settings, fsnav->settings_length, 0);
		if (cfg_ptr != NULL) {
			fsnav->imu_const.u = 0;
			printf("u_zero\n");
		}
			// поиск флага обнуления эксцентриситета в конфигурации
		cfg_ptr = fsnav_locate_token(e2_token, fsnav->cfg_settings, fsnav->settings_length, 0);
		if (cfg_ptr != NULL) {
			fsnav->imu_const.e2 = 0;
			printf("e2_zero\n");
		}
		
		// отключение плагинов в списке выполнения
			// поиск флага постоянста силы тяжести
		cfg_ptr = fsnav_locate_token(g_token, fsnav->cfg_settings, fsnav->settings_length, 0);
		if (cfg_ptr != NULL) {
			fsnav->suspend_plugin(fsnav_ins_gravity_normal);
			printf("g_const\n");
		}
		else
			fsnav->suspend_plugin(fsnav_ins_gravity_constant);
			// поиск флага счисления ориентации фильтром Маджвика
		cfg_ptr = fsnav_locate_token(madgwick_token, fsnav->imu->cfg, fsnav->imu->cfglength, '=');
		if (cfg_ptr != NULL) {
			madgwick_rate = atof(cfg_ptr); 
			if (madgwick_rate > 0 && isfinite(madgwick_rate)) {
				fsnav->suspend_plugin(fsnav_ins_attitude_rodrigues);
				printf("%s = %g\n", madgwick_token, madgwick_rate);
			}
			else
				fsnav->suspend_plugin(fsnav_ins_attitude_madgwick);
		}
		else
			fsnav->suspend_plugin(fsnav_ins_attitude_madgwick);
			// поиск флага выставки по акселерометрам
		cfg_ptr = fsnav_locate_token(accs_token, fsnav->cfg_settings, fsnav->settings_length, 0);
		if (cfg_ptr != NULL) {
			fsnav->suspend_plugin(fsnav_ins_alignment_static);
			printf("accs_align\n");
		}
		else
			fsnav->suspend_plugin(fsnav_ins_alignment_static_accs);
			// поиск флага обнуления угла курса на этапе выставки
		cfg_ptr = fsnav_locate_token(yaw_token, fsnav->cfg_settings, fsnav->settings_length, 0);
		if (cfg_ptr != NULL) {
			yaw_zero = 1;
			printf("yaw_zero\n");
		}
		else {
			yaw_zero = 0;
			fsnav->suspend_plugin(fsnav_ins_set_yaw_zero);
		}

		// временные параметры
			// поиск ограничения по времени в конфигурации
		cfg_ptr = fsnav_locate_token(limit_token, fsnav->cfg_settings, fsnav->settings_length, '=');
		if (cfg_ptr != NULL)
			time_limit = atof(cfg_ptr);
		if (cfg_ptr == NULL || time_limit <= 0)
			time_limit = limit_default;
			// поиск времени выставки в конфигурации
		cfg_ptr = fsnav_locate_token(t0_token, fsnav->imu->cfg, fsnav->imu->cfglength, '=');
		if (cfg_ptr != NULL)
			t0 = atof(cfg_ptr);
		if (cfg_ptr == NULL || t0 <= 0)
			t0 = t0_default;
	}

	// завершение работы
	else if (fsnav->mode < 0) {}

	// шаг основного цикла
	else {
		if (fsnav->imu->t > time_limit)
			fsnav->mode = -1;

		if (fsnav->imu->t > t0 && yaw_zero) {
			fsnav->suspend_plugin(fsnav_ins_set_yaw_zero);
			yaw_zero = 0;
		}
	}
}